

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)

{
  float fVar1;
  ImGuiDockNode *node_00;
  bool bVar2;
  float in_EDI;
  int n_2;
  int n_1;
  ImGuiID window_settings_dock_id;
  ImGuiWindowSettings *settings;
  bool want_removal;
  ImGuiDockNode *node;
  int n;
  ImVector<ImGuiDockNode_*> nodes_to_remove;
  ImGuiDataAuthority backup_root_node_authority_for_size;
  ImGuiDataAuthority backup_root_node_authority_for_pos;
  bool has_central_node;
  ImGuiDockNode *root_node;
  ImGuiDockContext *dc;
  ImGuiContext *ctx;
  undefined4 in_stack_ffffffffffffff28;
  ImGuiID in_stack_ffffffffffffff2c;
  ImGuiContext *in_stack_ffffffffffffff30;
  ImGuiDockNode *in_stack_ffffffffffffff38;
  ImGuiContext *in_stack_ffffffffffffff40;
  ImGuiDockNode *in_stack_ffffffffffffff48;
  ImGuiDockNode *in_stack_ffffffffffffff50;
  ImGuiDockNode *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  ImGuiContext *in_stack_ffffffffffffff70;
  int local_88;
  int local_84;
  ImGuiDockNode *local_80;
  int local_74;
  int local_70;
  ImGuiContext *local_68;
  int local_44;
  ImVector<ImGuiDockNode_*> local_40;
  int local_2c;
  int local_28;
  byte local_21;
  ImGuiDockNode *local_20;
  ImGuiDockContext *local_18;
  ImGuiContext *local_10;
  float local_4;
  
  local_10 = GImGui;
  local_18 = GImGui->DockContext;
  local_4 = in_EDI;
  if (in_EDI == 0.0) {
    local_80 = (ImGuiDockNode *)0x0;
  }
  else {
    local_80 = DockContextFindNodeByID(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  }
  local_20 = local_80;
  if ((local_4 == 0.0) || (local_80 != (ImGuiDockNode *)0x0)) {
    local_21 = 0;
    if (local_80 == (ImGuiDockNode *)0x0) {
      local_84 = 0;
    }
    else {
      local_84 = (int)((short)(*(short *)&local_80->field_0xb0 << 0xd) >> 0xd);
    }
    local_28 = local_84;
    if (local_80 == (ImGuiDockNode *)0x0) {
      local_88 = 0;
    }
    else {
      local_88 = (int)((short)(*(short *)&local_80->field_0xb0 << 10) >> 0xd);
    }
    local_2c = local_88;
    ImVector<ImGuiDockNode_*>::ImVector(&local_40);
    for (local_44 = 0; local_44 < (local_18->Nodes).Data.Size; local_44 = local_44 + 1) {
      in_stack_ffffffffffffff70 =
           (ImGuiContext *)
           ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                     ((ImVector<ImGuiStorage::ImGuiStoragePair> *)local_18,local_44);
      node_00 = (ImGuiDockNode *)
                ((anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)&in_stack_ffffffffffffff70->IO)->
                val_p;
      if (node_00 != (ImGuiDockNode *)0x0) {
        in_stack_ffffffffffffff6f = true;
        if ((local_4 != 0.0) &&
           (in_stack_ffffffffffffff6e = false, in_stack_ffffffffffffff6f = in_stack_ffffffffffffff6e
           , (float)node_00->ID != local_4)) {
          in_stack_ffffffffffffff60 = DockNodeGetRootNode(node_00);
          in_stack_ffffffffffffff6e = (float)in_stack_ffffffffffffff60->ID == local_4;
          in_stack_ffffffffffffff6f = in_stack_ffffffffffffff6e;
        }
        if ((bool)in_stack_ffffffffffffff6f != false) {
          bVar2 = ImGuiDockNode::IsCentralNode(node_00);
          if (bVar2) {
            local_21 = 1;
          }
          if (local_4 != 0.0) {
            DockContextQueueNotifyRemovedNode(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          }
          if (local_20 != (ImGuiDockNode *)0x0) {
            DockNodeMoveWindows(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          }
          ImVector<ImGuiDockNode_*>::push_back
                    ((ImVector<ImGuiDockNode_*> *)in_stack_ffffffffffffff30,
                     (ImGuiDockNode **)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                    );
        }
      }
    }
    if (local_20 != (ImGuiDockNode *)0x0) {
      *(ushort *)&local_20->field_0xb0 =
           *(ushort *)&local_20->field_0xb0 & 0xfff8 | (ushort)local_28 & 7;
      *(ushort *)&local_20->field_0xb0 =
           *(ushort *)&local_20->field_0xb0 & 0xffc7 | ((ushort)local_2c & 7) << 3;
    }
    local_68 = (ImGuiContext *)ImChunkStream<ImGuiWindowSettings>::begin(&local_10->SettingsWindows)
    ;
    while (local_68 != (ImGuiContext *)0x0) {
      fVar1 = (local_68->IO).DisplaySize.y;
      if (fVar1 != 0.0) {
        for (local_70 = 0; local_70 < local_40.Size; local_70 = local_70 + 1) {
          in_stack_ffffffffffffff48 =
               (ImGuiDockNode *)ImVector<ImGuiDockNode_*>::operator[](&local_40,local_70);
          if ((float)(*(ImGuiDockNode **)in_stack_ffffffffffffff48)->ID == fVar1) {
            (local_68->IO).DisplaySize.y = local_4;
            break;
          }
        }
      }
      in_stack_ffffffffffffff40 =
           (ImGuiContext *)
           ImChunkStream<ImGuiWindowSettings>::next_chunk
                     ((ImChunkStream<ImGuiWindowSettings> *)in_stack_ffffffffffffff48,
                      (ImGuiWindowSettings *)in_stack_ffffffffffffff40);
      local_68 = in_stack_ffffffffffffff40;
    }
    if (1 < local_40.Size) {
      qsort(local_40.Data,(long)local_40.Size,8,DockNodeComparerDepthMostFirst);
    }
    for (local_74 = 0; local_74 < local_40.Size; local_74 = local_74 + 1) {
      in_stack_ffffffffffffff30 = local_10;
      ImVector<ImGuiDockNode_*>::operator[](&local_40,local_74);
      DockContextRemoveNode
                (in_stack_ffffffffffffff70,
                 (ImGuiDockNode *)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                 SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
    }
    if (local_4 == 0.0) {
      ImGuiStorage::Clear((ImGuiStorage *)0x1c5fb4);
      ImVector<ImGuiDockRequest>::clear((ImVector<ImGuiDockRequest> *)in_stack_ffffffffffffff30);
    }
    else if ((local_21 & 1) != 0) {
      local_20->LocalFlags = local_20->LocalFlags | 0x800;
      local_20->CentralNode = local_20;
    }
    ImVector<ImGuiDockNode_*>::~ImVector((ImVector<ImGuiDockNode_*> *)in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockContext* dc = ctx->DockContext;

    ImGuiDockNode* root_node = root_id ? DockContextFindNodeByID(ctx, root_id) : NULL;
    if (root_id && root_node == NULL)
        return;
    bool has_central_node = false;

    ImGuiDataAuthority backup_root_node_authority_for_pos = root_node ? root_node->AuthorityForPos : ImGuiDataAuthority_Auto;
    ImGuiDataAuthority backup_root_node_authority_for_size = root_node ? root_node->AuthorityForSize : ImGuiDataAuthority_Auto;

    // Process active windows
    ImVector<ImGuiDockNode*> nodes_to_remove;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
        {
            bool want_removal = (root_id == 0) || (node->ID != root_id && DockNodeGetRootNode(node)->ID == root_id);
            if (want_removal)
            {
                if (node->IsCentralNode())
                    has_central_node = true;
                if (root_id != 0)
                    DockContextQueueNotifyRemovedNode(ctx, node);
                if (root_node)
                    DockNodeMoveWindows(root_node, node);
                nodes_to_remove.push_back(node);
            }
        }

    // DockNodeMoveWindows->DockNodeAddWindow will normally set those when reaching two windows (which is only adequate during interactive merge)
    // Make sure we don't lose our current pos/size. (FIXME-DOCK: Consider tidying up that code in DockNodeAddWindow instead)
    if (root_node)
    {
        root_node->AuthorityForPos = backup_root_node_authority_for_pos;
        root_node->AuthorityForSize = backup_root_node_authority_for_size;
    }

    // Apply to settings
    for (ImGuiWindowSettings* settings = ctx->SettingsWindows.begin(); settings != NULL; settings = ctx->SettingsWindows.next_chunk(settings))
        if (ImGuiID window_settings_dock_id = settings->DockId)
            for (int n = 0; n < nodes_to_remove.Size; n++)
                if (nodes_to_remove[n]->ID == window_settings_dock_id)
                {
                    settings->DockId = root_id;
                    break;
                }

    // Not really efficient, but easier to destroy a whole hierarchy considering DockContextRemoveNode is attempting to merge nodes
    if (nodes_to_remove.Size > 1)
        ImQsort(nodes_to_remove.Data, nodes_to_remove.Size, sizeof(ImGuiDockNode*), DockNodeComparerDepthMostFirst);
    for (int n = 0; n < nodes_to_remove.Size; n++)
        DockContextRemoveNode(ctx, nodes_to_remove[n], false);

    if (root_id == 0)
    {
        dc->Nodes.Clear();
        dc->Requests.clear();
    }
    else if (has_central_node)
    {
        root_node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
        root_node->CentralNode = root_node;
    }
}